

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osThread.cpp
# Opt level: O2

void osThread::dump_info(ostream *out)

{
  long lVar1;
  long lVar2;
  osMutex *this;
  osEvent *this_00;
  ostream *poVar3;
  char *pcVar4;
  long lVar5;
  
  std::operator<<(out,
                  "\n\n\"Reading\" means that the thread is reading a device or network socket\n\n")
  ;
  std::operator<<(out,"--------------------+------------------------------------\n");
  std::operator<<(out,"Thread Name         | State\n");
  std::operator<<(out,"--------------------+------------------------------------\n");
  osMutex::Take(&Mutex,
                "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/os_support/osThread.cpp"
                ,0x167);
  lVar5 = 0;
  do {
    if (lVar5 == 0x180) {
      osMutex::Give(&Mutex);
      return;
    }
    lVar1 = *(long *)((long)Threads + lVar5);
    if (lVar1 == 0) goto switchD_00109901_default;
    lVar2 = *(long *)out;
    *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 0x10) = 0x14;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(out + lVar2 + 0x18) = *(uint *)(out + lVar2 + 0x18) & 0xffffff4f | 0x20;
    poVar3 = std::operator<<(out,(char *)(lVar1 + 0xe0));
    std::operator<<(poVar3,"|");
    poVar3 = out;
    switch(*(undefined4 *)(lVar1 + 0x10c)) {
    case 0:
      pcVar4 = "init\n";
      goto LAB_001099e0;
    case 1:
      pcVar4 = "running\n";
LAB_001099e0:
      std::operator<<(out,pcVar4);
      break;
    case 2:
      this = *(osMutex **)(lVar1 + 0x110);
      if (this == (osMutex *)0x0) {
        pcVar4 = "pending on mutex \"UNKNOWN\"\n";
      }
      else {
        poVar3 = std::operator<<(out,"pending on mutex \"");
        pcVar4 = osMutex::GetName(this);
LAB_001099bf:
        poVar3 = std::operator<<(poVar3,pcVar4);
        pcVar4 = "\"\n";
      }
      goto LAB_001099f7;
    case 3:
      this_00 = *(osEvent **)(lVar1 + 0x110);
      if (this_00 != (osEvent *)0x0) {
        poVar3 = std::operator<<(out,"pending event \"");
        pcVar4 = osEvent::GetName(this_00);
        goto LAB_001099bf;
      }
      pcVar4 = "pending event \"UNKNOWN\"\n";
LAB_001099f7:
      std::operator<<(poVar3,pcVar4);
      break;
    case 4:
      poVar3 = std::operator<<(out,"sleeping ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(out," at ");
      poVar3 = std::operator<<(poVar3,*(char **)(lVar1 + 0x100));
      poVar3 = std::operator<<(poVar3," ");
      std::ostream::operator<<(poVar3,*(int *)(lVar1 + 0x108));
    }
switchD_00109901_default:
    lVar5 = lVar5 + 8;
  } while( true );
}

Assistant:

void osThread::dump_info(std::ostream& out)
{
#ifdef WIN32
    FILETIME creationTime;
    FILETIME exitTime;
    FILETIME kernelTime;
    FILETIME userTime;
    SYSTEMTIME sysTime;
    HANDLE handle;

    handle = GetCurrentProcess();
    out << "Process Priority   = 0x" << to_hex(GetPriorityClass(handle)) << "\n";
    if (GetProcessTimes(handle, &creationTime, &exitTime, &kernelTime, &userTime))
    {
        FileTimeToSystemTime(&kernelTime, &sysTime);
        out << "  Kernel Time      = ",
            out << std::setw(2) << std::setfill('0') << sysTime.wHour << ":";
        out << std::setw(2) << std::setfill('0') << sysTime.wMinute << ":";
        out << std::setw(2) << std::setfill('0') << sysTime.wSecond << ".";
        out << std::setw(2) << std::setfill('0') << sysTime.wMilliseconds << "\n";

        FileTimeToSystemTime(&userTime, &sysTime);
        out << "  User Time        = ",
            out << std::setw(2) << std::setfill('0') << sysTime.wHour << ":";
        out << std::setw(2) << std::setfill('0') << sysTime.wMinute << ":";
        out << std::setw(2) << std::setfill('0') << sysTime.wSecond << ".";
        out << std::setw(2) << std::setfill('0') << sysTime.wMilliseconds << "\n";
    }
#endif

    out << "\n\n\"Reading\" means that the thread is reading a device or network socket\n\n";

#ifdef WIN32
    out << "----+--------------------+-------+--------------+--------------+-----------------------"
           "---"
           "\n";
    out << "Pri |Thread Name         | ID    | Kernel Time  |  User Time   | State\n";
    out << "----+--------------------+-------+--------------+--------------+-----------------------"
           "---"
           "\n";
#elif __linux__
    out << "--------------------+------------------------------------\n";
    out << "Thread Name         | State\n";
    out << "--------------------+------------------------------------\n";
#endif

    Mutex.Take(__FILE__, __LINE__);

    for (int i = 0; i < MAX_THREADS; i++)
    {
        osThread* thread = Threads[i];
        if (!thread)
        {
            continue;
        }
#ifdef WIN32
        handle = thread->GetHandle();

        int priority;
        if (handle)
        {
            priority = GetThreadPriority(handle);
        }
        else
        {
            priority = -1;
        }
        GetThreadTimes(handle, &creationTime, &exitTime, &kernelTime, &userTime);

        out << std::setw(3) << priority << " |";
        out << std::setw(20) << std::left << thread->Name << "|";
        out << std::setw(6) << handle << " | ";

        FileTimeToSystemTime(&kernelTime, &sysTime);
        out << std::setw(2) << std::setfill('0') << sysTime.wHour << ":";
        out << std::setw(2) << std::setfill('0') << sysTime.wMinute << ":";
        out << std::setw(2) << std::setfill('0') << sysTime.wSecond << ".";
        out << std::setw(2) << std::setfill('0') << sysTime.wMilliseconds << " | ";

        FileTimeToSystemTime(&userTime, &sysTime);
        out << std::setw(2) << std::setfill('0') << sysTime.wHour << ":";
        out << std::setw(2) << std::setfill('0') << sysTime.wMinute << ":";
        out << std::setw(2) << std::setfill('0') << sysTime.wSecond << ".";
        out << std::setw(2) << std::setfill('0') << sysTime.wMilliseconds << " | ";

#elif __linux__
        out << std::setw(20) << std::left << thread->Name << "|";
#endif

        // Find out what this thread is doing
        switch (thread->State)
        {
        case INIT: out << "init\n"; break;
        case RUNNING: out << "running\n"; break;
        case PENDING_MUTEX:
        {
            osMutex* obj = (osMutex*)(thread->StateObject);
            if (obj != nullptr)
            {
                out << "pending on mutex \"" << obj->GetName() << "\"\n";
            }
            else
            {
                out << "pending on mutex \"UNKNOWN\"\n";
            }
            break;
        }
        case PENDING_EVENT:
        {
            osEvent* obj = (osEvent*)(thread->StateObject);
            if (obj != nullptr)
            {
                out << "pending event \"" << obj->GetName() << "\"\n";
            }
            else
            {
                out << "pending event \"UNKNOWN\"\n";
            }
            break;
        }
        case SLEEPING:
            out << "sleeping " << thread->USleepTime;
            out << " at " << thread->Filename << " " << thread->Linenumber;
            break;
        }
    }

    Mutex.Give();
}